

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntrySshortArray(TIFF *tif,TIFFDirEntry *direntry,int16_t **value)

{
  uint uVar1;
  ushort *p;
  uint local_dc;
  ushort *puStack_d8;
  uint32_t n_6;
  int16_t *mb_5;
  int64_t *ma_5;
  ushort *puStack_c0;
  uint32_t n_5;
  int16_t *mb_4;
  uint64_t *ma_4;
  ushort *puStack_a8;
  uint32_t n_4;
  int16_t *mb_3;
  int32_t *ma_3;
  ushort *puStack_90;
  uint32_t n_3;
  int16_t *mb_2;
  uint32_t *ma_2;
  ushort *puStack_78;
  uint32_t n_2;
  int16_t *mb_1;
  int8_t *ma_1;
  ushort *puStack_60;
  uint32_t n_1;
  int16_t *mb;
  uint8_t *ma;
  uint16_t *puStack_48;
  uint32_t n;
  uint16_t *m;
  int16_t *data;
  void *origdata;
  uint32_t count;
  TIFFReadDirEntryErr err;
  int16_t **value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  uVar1 = (uint)direntry->tdir_type;
  if ((((uVar1 == 1) || (uVar1 - 3 < 2)) || (uVar1 == 6)) ||
     ((uVar1 - 8 < 2 || (uVar1 == 0x10 || uVar1 == 0x11)))) {
    _count = value;
    value_local = (int16_t **)direntry;
    direntry_local = (TIFFDirEntry *)tif;
    origdata._4_4_ = TIFFReadDirEntryArray(tif,direntry,(uint32_t *)&origdata,2,&data);
    if ((origdata._4_4_ == TIFFReadDirEntryErrOk) && (data != (int16_t *)0x0)) {
      if (*(short *)((long)value_local + 2) == 3) {
        puStack_48 = (uint16_t *)data;
        for (ma._4_4_ = 0; origdata._4_4_ = 0, ma._4_4_ < (uint)origdata; ma._4_4_ = ma._4_4_ + 1) {
          if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
            TIFFSwabShort(puStack_48);
          }
          origdata._4_4_ = TIFFReadDirEntryCheckRangeSshortShort(*puStack_48);
          if (origdata._4_4_ != TIFFReadDirEntryErrOk) {
            _TIFFfreeExt((TIFF *)direntry_local,data);
            return origdata._4_4_;
          }
          puStack_48 = puStack_48 + 1;
        }
        *_count = data;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      else if (*(short *)((long)value_local + 2) == 8) {
        *_count = data;
        if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
          TIFFSwabArrayOfShort((uint16_t *)*_count,(ulong)(uint)origdata);
        }
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      else {
        p = (ushort *)_TIFFmallocExt((TIFF *)direntry_local,(ulong)((uint)origdata << 1));
        if (p == (ushort *)0x0) {
          _TIFFfreeExt((TIFF *)direntry_local,data);
          tif_local._4_4_ = TIFFReadDirEntryErrAlloc;
        }
        else {
          switch(*(undefined2 *)((long)value_local + 2)) {
          case 1:
            mb = data;
            puStack_60 = p;
            for (ma_1._4_4_ = 0; ma_1._4_4_ < (uint)origdata; ma_1._4_4_ = ma_1._4_4_ + 1) {
              *puStack_60 = (ushort)(byte)*mb;
              puStack_60 = puStack_60 + 1;
              mb = (int16_t *)((long)mb + 1);
            }
            break;
          case 4:
            mb_2 = data;
            puStack_90 = p;
            for (ma_3._4_4_ = 0; ma_3._4_4_ < (uint)origdata; ma_3._4_4_ = ma_3._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)mb_2);
              }
              origdata._4_4_ = TIFFReadDirEntryCheckRangeSshortLong(*(uint32_t *)mb_2);
              if (origdata._4_4_ != TIFFReadDirEntryErrOk) break;
              *puStack_90 = (ushort)*(undefined4 *)mb_2;
              puStack_90 = puStack_90 + 1;
              mb_2 = mb_2 + 2;
            }
            break;
          case 6:
            mb_1 = data;
            puStack_78 = p;
            for (ma_2._4_4_ = 0; ma_2._4_4_ < (uint)origdata; ma_2._4_4_ = ma_2._4_4_ + 1) {
              *puStack_78 = (short)(char)*mb_1;
              puStack_78 = puStack_78 + 1;
              mb_1 = (int16_t *)((long)mb_1 + 1);
            }
            break;
          case 9:
            mb_3 = data;
            puStack_a8 = p;
            for (ma_4._4_4_ = 0; ma_4._4_4_ < (uint)origdata; ma_4._4_4_ = ma_4._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)mb_3);
              }
              origdata._4_4_ = TIFFReadDirEntryCheckRangeSshortSlong(*(int32_t *)mb_3);
              if (origdata._4_4_ != TIFFReadDirEntryErrOk) break;
              *puStack_a8 = (ushort)*(undefined4 *)mb_3;
              puStack_a8 = puStack_a8 + 1;
              mb_3 = mb_3 + 2;
            }
            break;
          case 0x10:
            mb_4 = data;
            puStack_c0 = p;
            for (ma_5._4_4_ = 0; ma_5._4_4_ < (uint)origdata; ma_5._4_4_ = ma_5._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)mb_4);
              }
              origdata._4_4_ = TIFFReadDirEntryCheckRangeSshortLong8(*(uint64_t *)mb_4);
              if (origdata._4_4_ != TIFFReadDirEntryErrOk) break;
              *puStack_c0 = (ushort)*(undefined8 *)mb_4;
              puStack_c0 = puStack_c0 + 1;
              mb_4 = mb_4 + 4;
            }
            break;
          case 0x11:
            mb_5 = data;
            puStack_d8 = p;
            for (local_dc = 0; local_dc < (uint)origdata; local_dc = local_dc + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)mb_5);
              }
              origdata._4_4_ = TIFFReadDirEntryCheckRangeSshortSlong8(*(int64_t *)mb_5);
              if (origdata._4_4_ != TIFFReadDirEntryErrOk) break;
              *puStack_d8 = (ushort)*(undefined8 *)mb_5;
              puStack_d8 = puStack_d8 + 1;
              mb_5 = mb_5 + 4;
            }
          }
          _TIFFfreeExt((TIFF *)direntry_local,data);
          if (origdata._4_4_ == TIFFReadDirEntryErrOk) {
            *_count = (int16_t *)p;
            tif_local._4_4_ = TIFFReadDirEntryErrOk;
          }
          else {
            _TIFFfreeExt((TIFF *)direntry_local,p);
            tif_local._4_4_ = origdata._4_4_;
          }
        }
      }
    }
    else {
      *_count = (int16_t *)0x0;
      tif_local._4_4_ = origdata._4_4_;
    }
  }
  else {
    tif_local._4_4_ = TIFFReadDirEntryErrType;
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshortArray(TIFF *tif, TIFFDirEntry *direntry, int16_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    int16_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 2, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_SHORT:
        {
            uint16_t *m;
            uint32_t n;
            m = (uint16_t *)origdata;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(m);
                err = TIFFReadDirEntryCheckRangeSshortShort(*m);
                if (err != TIFFReadDirEntryErrOk)
                {
                    _TIFFfreeExt(tif, origdata);
                    return (err);
                }
                m++;
            }
            *value = (int16_t *)origdata;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            *value = (int16_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfShort((uint16_t *)(*value), count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (int16_t *)_TIFFmallocExt(tif, count * 2);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    if (err != TIFFReadDirEntryErrOk)
    {
        _TIFFfreeExt(tif, data);
        return (err);
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}